

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

void sarima_exec(sarima_object obj,double *inp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  double eps;
  int trparams;
  int cssml;
  int M;
  int N;
  int Q;
  int D;
  int P;
  int s;
  int d;
  int q;
  int p;
  double *inp_local;
  sarima_object obj_local;
  
  iVar8 = obj->p;
  iVar1 = obj->q;
  iVar2 = obj->d;
  iVar3 = obj->N;
  iVar4 = obj->P;
  iVar5 = obj->Q;
  iVar6 = obj->D;
  iVar7 = obj->s;
  if (obj->method == 0) {
    iVar8 = as154_seas(inp,obj->N,obj->optmethod,obj->p,obj->d,obj->q,obj->s,obj->P,obj->D,obj->Q,
                       (double *)(obj + 1),(double *)(&obj[1].N + (long)iVar8 * 2),
                       (double *)(&obj[1].N + (long)iVar8 * 2 + (long)iVar1 * 2),
                       (double *)(&obj[1].N + (long)iVar8 * 2 + (long)iVar1 * 2 + (long)iVar4 * 2),
                       &obj->mean,&obj->var,&obj->loglik,
                       (double *)
                       ((long)obj +
                       (long)(iVar7 * iVar6) * -8 +
                       (long)iVar2 * -8 +
                       (long)iVar3 * 8 +
                       (long)iVar5 * 8 + (long)iVar4 * 8 + (long)iVar1 * 8 + (long)iVar8 * 8 + 0x98)
                       ,obj->cssml);
    obj->retval = iVar8;
    iVar8 = obj->Nused;
    dVar10 = obj->loglik;
    dVar9 = log(6.28318);
    obj->loglik = (double)iVar8 * (dVar10 + dVar10 + 1.0 + dVar9) * -0.5;
    obj->aic = ((double)(obj->p + obj->q + obj->P + obj->Q + obj->M) * 2.0 -
               (obj->loglik + obj->loglik)) + 2.0;
  }
  else if (obj->method == 1) {
    iVar8 = css_seas(inp,obj->N,obj->optmethod,obj->p,obj->d,obj->q,obj->s,obj->P,obj->D,obj->Q,
                     (double *)(obj + 1),(double *)(&obj[1].N + (long)iVar8 * 2),
                     (double *)(&obj[1].N + (long)iVar8 * 2 + (long)iVar1 * 2),
                     (double *)(&obj[1].N + (long)iVar8 * 2 + (long)iVar1 * 2 + (long)iVar4 * 2),
                     &obj->mean,&obj->var,&obj->loglik,
                     (double *)
                     ((long)obj +
                     (long)(iVar7 * iVar6) * -8 +
                     (long)iVar2 * -8 +
                     (long)iVar3 * 8 +
                     (long)iVar5 * 8 + (long)iVar4 * 8 + (long)iVar1 * 8 + (long)iVar8 * 8 + 0x98));
    obj->retval = iVar8;
    iVar8 = obj->Nused;
    dVar10 = obj->loglik;
    dVar9 = log(6.28318);
    obj->loglik = (double)iVar8 * (dVar10 + dVar10 + 1.0 + dVar9) * -0.5;
  }
  else if (obj->method == 2) {
    dVar10 = macheps();
    iVar8 = nlalsms(inp,obj->N,obj->p,obj->d,obj->q,(double *)(obj + 1),
                    (double *)(&obj[1].N + (long)iVar8 * 2),obj->s,obj->P,obj->D,obj->Q,
                    (double *)(&obj[1].N + (long)iVar8 * 2 + (long)iVar1 * 2),
                    (double *)(&obj[1].N + (long)iVar8 * 2 + (long)iVar1 * 2 + (long)iVar4 * 2),
                    obj->M,&obj->mean,&obj->var,dVar10,
                    (double *)
                    ((long)obj +
                    (long)(iVar7 * iVar6) * -8 +
                    (long)iVar2 * -8 +
                    (long)iVar3 * 8 +
                    (long)iVar5 * 8 + (long)iVar4 * 8 + (long)iVar1 * 8 + (long)iVar8 * 8 + 0x98),
                    (double *)
                    (&obj[1].N +
                    (long)iVar8 * 2 + (long)iVar1 * 2 + (long)iVar4 * 2 + (long)iVar5 * 2));
    obj->retval = iVar8;
  }
  return;
}

Assistant:

void sarima_exec(sarima_object obj, double *inp) {
	int p, q, d, s,P,D,Q,N, M,cssml,trparams;
	double eps;

	p = obj->p;
	q = obj->q;
	d = obj->d;
	N = obj->N;
	P = obj->P;
	Q = obj->Q;
	D = obj->D;
	s = obj->s;

	M = obj->M;

	if (obj->method == 0) {
		obj->retval = as154_seas(inp, obj->N, obj->optmethod, obj->p, obj->d, obj->q, obj->s, obj->P, obj->D, obj->Q, obj->params, obj->params + p, obj->params + p + q, 
			obj->params + p + q + P, &obj->mean, &obj->var, &obj->loglik, obj->params + p + q + P + Q + N - d - s*D,obj->cssml);
		obj->loglik = -0.5 * (obj->Nused * (2 * obj->loglik + 1.0 + log(2 * 3.14159)));
		obj->aic = -2.0 * obj->loglik + 2.0 * (obj->p + obj->q + obj->P + obj->Q + obj->M) + 2.0;
	}
	else if (obj->method == 1) {
		obj->retval = css_seas(inp, obj->N, obj->optmethod, obj->p, obj->d, obj->q, obj->s, obj->P, obj->D, obj->Q, obj->params, obj->params + p, obj->params + p + q,
			obj->params + p + q + P, &obj->mean, &obj->var, &obj->loglik, obj->params + p + q + P + Q + N - d - s*D);
		obj->loglik = -0.5 * (obj->Nused * (2 * obj->loglik + 1.0 + log(2 * 3.14159)));
	}
	else if (obj->method == 2) {
		eps = macheps();
		obj->retval = nlalsms(inp, obj->N, obj->p, obj->d, obj->q, obj->params, obj->params + p, obj->s, obj->P, obj->D, obj->Q, obj->params + p + q, obj->params + p + q + P, obj->M, &obj->mean, &obj->var, eps,
			obj->params + p + q + P + Q + N - d - s*D, obj->params + p + q + P + Q);
	}

}